

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_parse.c
# Opt level: O2

void l2_parse_finalize(void)

{
  l2_token_stream_destroy(g_parser_p->token_stream_p);
  l2_call_stack_destroy(g_parser_p->call_stack_p);
  l2_scope_destroy(g_parser_p->global_scope_p);
  l2_gc_destroy(g_parser_p->gc_list_p);
  l2_storage_destroy(g_parser_p->storage_p);
  free(g_parser_p);
  return;
}

Assistant:

void l2_parse_finalize() {
    l2_token_stream_destroy(g_parser_p->token_stream_p);
    l2_call_stack_destroy(g_parser_p->call_stack_p);
    l2_scope_destroy(g_parser_p->global_scope_p);
    l2_gc_destroy(g_parser_p->gc_list_p);
    l2_storage_destroy(g_parser_p->storage_p);
    free(g_parser_p);
}